

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,DebugWriter *w,
          Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015bc47d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x449);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndConsumeInstT<EquivTrivialLastPatCharScannerMixin> aka SyncToLiteralEquivTrivialLastPatCharAndConsume"
                    );
  DebugWriter::Print(w,L"(");
  EquivScannerMixinT<1U>::Print(&this->super_EquivScannerMixinT<1U>,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015bc47d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::EquivScannerMixinT<1u>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_EquivScannerMixinT<1U>,
               L"EquivTrivialLastPatCharScannerMixin");
    DebugWriter::Unindent(w);
  }
  return 0x449;
}

Assistant:

int SyncToLiteralAndConsumeInstT<EquivTrivialLastPatCharScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndConsumeInstT<EquivTrivialLastPatCharScannerMixin> aka SyncToLiteralEquivTrivialLastPatCharAndConsume");
        PRINT_MIXIN(EquivTrivialLastPatCharScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(EquivTrivialLastPatCharScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_RE_BYTECODE_END();
    }